

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void av1_upscale_normative_rows
               (AV1_COMMON *cm,uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int plane,
               int rows)

{
  byte bVar1;
  uint pad_left_00;
  int iVar2;
  int out_length;
  int32_t x_step_qn_00;
  int32_t height;
  int in_stride;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_RCX;
  undefined8 unaff_RBX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int in_R9D;
  _Bool success;
  int pad_right;
  int pad_left;
  int dst_width;
  uint8_t *dst_ptr;
  uint8_t *src_ptr;
  int upscaled_x1;
  int upscaled_x0;
  int src_width;
  int downscaled_x1;
  int downscaled_x0;
  int j;
  int32_t x0_qn;
  int32_t x_step_qn;
  TileInfo tile_col;
  int superres_denom;
  int upscaled_plane_width;
  int downscaled_plane_width;
  int ss_x;
  int is_uv;
  bool local_b6;
  _Bool local_b5;
  int in_stack_ffffffffffffff68;
  int height_00;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int local_6c;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffc8;
  
  local_b6 = false;
  if (0 < in_R9D) {
    local_b6 = in_RDI->seq_params->subsampling_x != 0;
  }
  pad_left_00 = (uint)local_b6;
  iVar2 = in_RDI->width + ((1 << local_b6) >> 1) >> local_b6;
  out_length = in_RDI->superres_upscaled_width + ((1 << local_b6) >> 1) >> local_b6;
  bVar1 = in_RDI->superres_scale_denominator;
  x_step_qn_00 = av1_get_upscale_convolve_step(iVar2,out_length);
  height = get_upscale_convolve_x0(iVar2,out_length,x_step_qn_00);
  for (iVar2 = 0; iVar2 < (in_RDI->tiles).cols; iVar2 = iVar2 + 1) {
    av1_tile_set_col((TileInfo *)&stack0xffffffffffffff8c,in_RDI,iVar2);
    in_stride = local_6c << (2U - (char)pad_left_00 & 0x1f);
    iVar3 = in_stack_ffffffffffffff98 << (2U - (char)pad_left_00 & 0x1f);
    iVar4 = iVar3 - in_stride;
    iVar5 = (int)(in_stride * (uint)bVar1) / 8;
    height_00 = out_length;
    if (iVar2 != (in_RDI->tiles).cols + -1) {
      height_00 = (int)(iVar3 * (uint)bVar1) / 8;
    }
    iVar3 = height_00 - iVar5;
    if (in_RDI->seq_params->use_highbitdepth == '\0') {
      local_b5 = upscale_normative_rect
                           ((uint8_t *)CONCAT44(iVar4,iVar5),height_00,in_stack_ffffffffffffff68,
                            (int)((ulong)(in_RSI + in_stride) >> 0x20),(uint8_t *)(in_RCX + iVar5),
                            iVar3,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffffa0,out_length,pad_left_00,in_R9D);
    }
    else {
      local_b5 = highbd_upscale_normative_rect
                           ((uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,x_step_qn_00),height,iVar2
                            ,in_stride,(uint8_t *)CONCAT44(iVar4,iVar5),height_00,pad_left_00,in_R9D
                            ,(int)in_RCX,in_stack_ffffffffffffffc8,(int)in_RSI,(int)in_RDI,
                            (int)unaff_RBX);
    }
    if (local_b5 == false) {
      aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Error upscaling frame");
    }
    height = iVar3 * x_step_qn_00 + iVar4 * -0x4000 + height;
  }
  return;
}

Assistant:

void av1_upscale_normative_rows(const AV1_COMMON *cm, const uint8_t *src,
                                int src_stride, uint8_t *dst, int dst_stride,
                                int plane, int rows) {
  const int is_uv = (plane > 0);
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int downscaled_plane_width = ROUND_POWER_OF_TWO(cm->width, ss_x);
  const int upscaled_plane_width =
      ROUND_POWER_OF_TWO(cm->superres_upscaled_width, ss_x);
  const int superres_denom = cm->superres_scale_denominator;

  TileInfo tile_col;
  const int32_t x_step_qn = av1_get_upscale_convolve_step(
      downscaled_plane_width, upscaled_plane_width);
  int32_t x0_qn = get_upscale_convolve_x0(downscaled_plane_width,
                                          upscaled_plane_width, x_step_qn);

  for (int j = 0; j < cm->tiles.cols; j++) {
    av1_tile_set_col(&tile_col, cm, j);
    // Determine the limits of this tile column in both the source
    // and destination images.
    // Note: The actual location which we start sampling from is
    // (downscaled_x0 - 1 + (x0_qn/2^14)), and this quantity increases
    // by exactly dst_width * (x_step_qn/2^14) pixels each iteration.
    const int downscaled_x0 = tile_col.mi_col_start << (MI_SIZE_LOG2 - ss_x);
    const int downscaled_x1 = tile_col.mi_col_end << (MI_SIZE_LOG2 - ss_x);
    const int src_width = downscaled_x1 - downscaled_x0;

    const int upscaled_x0 = (downscaled_x0 * superres_denom) / SCALE_NUMERATOR;
    int upscaled_x1;
    if (j == cm->tiles.cols - 1) {
      // Note that we can't just use AOMMIN here - due to rounding,
      // (downscaled_x1 * superres_denom) / SCALE_NUMERATOR may be less than
      // upscaled_plane_width.
      upscaled_x1 = upscaled_plane_width;
    } else {
      upscaled_x1 = (downscaled_x1 * superres_denom) / SCALE_NUMERATOR;
    }

    const uint8_t *const src_ptr = src + downscaled_x0;
    uint8_t *const dst_ptr = dst + upscaled_x0;
    const int dst_width = upscaled_x1 - upscaled_x0;

    const int pad_left = (j == 0);
    const int pad_right = (j == cm->tiles.cols - 1);

    bool success;
#if CONFIG_AV1_HIGHBITDEPTH
    if (cm->seq_params->use_highbitdepth)
      success = highbd_upscale_normative_rect(
          src_ptr, rows, src_width, src_stride, dst_ptr, rows, dst_width,
          dst_stride, x_step_qn, x0_qn, pad_left, pad_right,
          cm->seq_params->bit_depth);
    else
      success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                       dst_ptr, rows, dst_width, dst_stride,
                                       x_step_qn, x0_qn, pad_left, pad_right);
#else
    success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                     dst_ptr, rows, dst_width, dst_stride,
                                     x_step_qn, x0_qn, pad_left, pad_right);
#endif
    if (!success) {
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Error upscaling frame");
    }
    // Update the fractional pixel offset to prepare for the next tile column.
    x0_qn += (dst_width * x_step_qn) - (src_width << RS_SCALE_SUBPEL_BITS);
  }
}